

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

char * Diligent::GetRenderDeviceTypeString(RENDER_DEVICE_TYPE DeviceType,bool bGetEnumString)

{
  char *pcVar1;
  char *pcVar2;
  string msg;
  string local_28;
  
  switch(DeviceType) {
  case RENDER_DEVICE_TYPE_UNDEFINED:
    pcVar2 = "RENDER_DEVICE_TYPE_UNDEFINED";
    pcVar1 = "Undefined";
    break;
  case RENDER_DEVICE_TYPE_D3D11:
    pcVar2 = "RENDER_DEVICE_TYPE_D3D11";
    pcVar1 = "Direct3D11";
    break;
  case RENDER_DEVICE_TYPE_D3D12:
    pcVar2 = "RENDER_DEVICE_TYPE_D3D12";
    pcVar1 = "Direct3D12";
    break;
  case RENDER_DEVICE_TYPE_GL:
    pcVar2 = "RENDER_DEVICE_TYPE_GL";
    pcVar1 = "OpenGL";
    break;
  case RENDER_DEVICE_TYPE_GLES:
    pcVar2 = "RENDER_DEVICE_TYPE_GLES";
    pcVar1 = "OpenGLES";
    break;
  case RENDER_DEVICE_TYPE_VULKAN:
    pcVar2 = "RENDER_DEVICE_TYPE_VULKAN";
    pcVar1 = "Vulkan";
    break;
  case RENDER_DEVICE_TYPE_METAL:
    pcVar2 = "RENDER_DEVICE_TYPE_METAL";
    pcVar1 = "Metal";
    break;
  case RENDER_DEVICE_TYPE_WEBGPU:
    pcVar2 = "RENDER_DEVICE_TYPE_WEBGPU";
    pcVar1 = "WebGPU";
    break;
  default:
    FormatString<char[32]>(&local_28,(char (*) [32])"Unknown/unsupported device type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetRenderDeviceTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x636);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    return "UNKNOWN";
  }
  if (bGetEnumString) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char* GetRenderDeviceTypeString(RENDER_DEVICE_TYPE DeviceType, bool bGetEnumString)
{
    static_assert(RENDER_DEVICE_TYPE_COUNT == 8, "Did you add a new device type? Please update the switch below.");
    switch (DeviceType)
    {
        // clang-format off
        case RENDER_DEVICE_TYPE_UNDEFINED: return bGetEnumString ? "RENDER_DEVICE_TYPE_UNDEFINED" : "Undefined";  break;
        case RENDER_DEVICE_TYPE_D3D11:     return bGetEnumString ? "RENDER_DEVICE_TYPE_D3D11"     : "Direct3D11"; break;
        case RENDER_DEVICE_TYPE_D3D12:     return bGetEnumString ? "RENDER_DEVICE_TYPE_D3D12"     : "Direct3D12"; break;
        case RENDER_DEVICE_TYPE_GL:        return bGetEnumString ? "RENDER_DEVICE_TYPE_GL"        : "OpenGL";     break;
        case RENDER_DEVICE_TYPE_GLES:      return bGetEnumString ? "RENDER_DEVICE_TYPE_GLES"      : "OpenGLES";   break;
        case RENDER_DEVICE_TYPE_VULKAN:    return bGetEnumString ? "RENDER_DEVICE_TYPE_VULKAN"    : "Vulkan";     break;
        case RENDER_DEVICE_TYPE_METAL:     return bGetEnumString ? "RENDER_DEVICE_TYPE_METAL"     : "Metal";      break;
        case RENDER_DEVICE_TYPE_WEBGPU:    return bGetEnumString ? "RENDER_DEVICE_TYPE_WEBGPU"    : "WebGPU";     break;
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported device type"); return "UNKNOWN";
    }
}